

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int in_EDX;
  long in_RSI;
  LogMessage *in_RDI;
  bool bVar4;
  int bytes;
  uint8 *buffer_base;
  int total_written;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff68;
  int local_74;
  LogMessage local_58;
  int local_1c;
  long local_18;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  if (((ulong)in_RDI->filename_ & 0x10000000000) != 0) {
    this_00 = &local_58;
    internal::LogMessage::LogMessage
              (in_RDI,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20),(char *)this_00,
               in_stack_ffffffffffffff5c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    internal::LogMessage::~LogMessage((LogMessage *)0x3c96bc);
  }
  local_74 = 0;
  while( true ) {
    if (local_1c <= local_74) {
      return true;
    }
    do {
      sVar2 = write(*(int *)&in_RDI->filename_,(void *)(local_18 + local_74),
                    (long)(local_1c - local_74));
      iVar1 = (int)sVar2;
      bVar4 = false;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (iVar1 < 1) break;
    local_74 = iVar1 + local_74;
  }
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    in_RDI->line_ = *piVar3;
  }
  return false;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(const void* buffer,
                                                      int size) {
  GOOGLE_CHECK(!is_closed_);
  int total_written = 0;

  const uint8* buffer_base = reinterpret_cast<const uint8*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}